

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O0

int rtr_undo_update_spki_table(rtr_socket *rtr_socket,spki_table *spki_table,void *pdu)

{
  pdu_type pVar1;
  long in_FS_OFFSET;
  int local_b0;
  int rtval;
  pdu_type type;
  void *pdu_local;
  spki_table *spki_table_local;
  rtr_socket *rtr_socket_local;
  spki_record entry;
  
  entry.socket = *(rtr_socket **)(in_FS_OFFSET + 0x28);
  pVar1 = rtr_get_pdu_type(pdu);
  if (pVar1 != ROUTER_KEY) {
    __assert_fail("type == ROUTER_KEY",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/rtr/packets.c"
                  ,0x318,
                  "int rtr_undo_update_spki_table(struct rtr_socket *, struct spki_table *, void *)"
                 );
  }
  rtr_key_pdu_2_spki_record
            (rtr_socket,(pdu_router_key *)pdu,(spki_record *)&rtr_socket_local,ROUTER_KEY);
  local_b0 = -1;
  if (*(char *)((long)pdu + 2) == '\x01') {
    local_b0 = spki_table_remove_entry(spki_table,(spki_record *)&rtr_socket_local);
  }
  else if (*(char *)((long)pdu + 2) == '\0') {
    local_b0 = spki_table_add_entry(spki_table,(spki_record *)&rtr_socket_local);
  }
  if (*(rtr_socket **)(in_FS_OFFSET + 0x28) != entry.socket) {
    __stack_chk_fail();
  }
  return local_b0;
}

Assistant:

static int rtr_undo_update_spki_table(struct rtr_socket *rtr_socket, struct spki_table *spki_table, void *pdu)
{
	const enum pdu_type type = rtr_get_pdu_type(pdu);

	assert(type == ROUTER_KEY);

	struct spki_record entry;

	rtr_key_pdu_2_spki_record(rtr_socket, pdu, &entry, type);

	int rtval = RTR_ERROR;
	// invert add/remove operation
	if (((struct pdu_router_key *)pdu)->flags == 1)
		rtval = spki_table_remove_entry(spki_table, &entry);
	else if (((struct pdu_router_key *)pdu)->flags == 0)
		rtval = spki_table_add_entry(spki_table, &entry);
	return rtval;
}